

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  size_t sVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  string flag_str;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  size_t local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--","");
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    sVar1 = local_68;
    plVar3 = local_70;
    iVar2 = strncmp(str,(char *)local_70,local_68);
    if (iVar2 == 0) {
      pcVar6 = str + sVar1;
      if ((!def_optional) || (pcVar5 = pcVar6, *pcVar6 != '\0')) {
        pcVar5 = (char *)0x0;
        if (*pcVar6 == '=') {
          pcVar5 = pcVar6 + 1;
        }
      }
    }
    else {
      pcVar5 = (char *)0x0;
    }
    if (plVar3 != &local_60) {
      operator_delete(plVar3,local_60 + 1);
    }
  }
  return pcVar5;
}

Assistant:

const char* ParseFlagValue(const char* str,
                           const char* flag,
                           bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str = std::string("--") + GTEST_FLAG_PREFIX_ + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}